

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O0

void __thiscall
csv::internals::MmapParser::MmapParser
          (MmapParser *this,string_view filename,CSVFormat *format,ColNamesPtr *col_names)

{
  const_pointer pvVar1;
  size_t sVar2;
  char *extraout_RDX;
  string_view filename_00;
  ColNamesPtr *col_names_local;
  CSVFormat *format_local;
  MmapParser *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (MmapParser *)filename._M_len;
  IBasicCSVParser::IBasicCSVParser(&this->super_IBasicCSVParser,format,col_names);
  (this->super_IBasicCSVParser)._vptr_IBasicCSVParser = (_func_int **)&PTR__MmapParser_00136cb8;
  std::__cxx11::string::string((string *)&this->_filename);
  this->mmap_pos = 0;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::operator=((string *)&this->_filename,pvVar1);
  filename_00._M_str = extraout_RDX;
  filename_00._M_len = filename_local._M_len;
  sVar2 = get_file_size((internals *)this_local,filename_00);
  (this->super_IBasicCSVParser).source_size = sVar2;
  return;
}

Assistant:

MmapParser(csv::string_view filename,
                const CSVFormat& format,
                const ColNamesPtr& col_names = nullptr
            ) : IBasicCSVParser(format, col_names) {
                this->_filename = filename.data();
                this->source_size = get_file_size(filename);
            }